

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O1

Client * __thiscall
kj::Function<capnproto_test::capnp::test::TestMembrane::Thing::Client_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/membrane-test.c++:306:17)>
::operator()(Client *__return_storage_ptr__,
            Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_membrane_test_c__:306:17)>
            *this)

{
  CapTableBuilder *pCVar1;
  WirePointer *pWVar2;
  undefined8 uVar3;
  Disposer *pDVar4;
  long *plVar5;
  RequestHook *pRVar6;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  Own<capnp::ClientHook> OVar7;
  Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  local_110;
  undefined1 local_d8 [40];
  undefined8 local_b0;
  short local_a4;
  undefined4 local_a0;
  undefined8 *local_98;
  long *local_90;
  Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  local_88;
  Maybe<capnp::MessageSize> local_50;
  WirePointer *local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined4 local_20;
  
  local_50.ptr.isSet = false;
  capnproto_test::capnp::test::TestMembrane::Client::makeThingRequest
            (&local_88,&((this->f).env)->membraned,&local_50);
  capnp::
  Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  ::send(&local_110,(int)&local_88,__buf,in_RCX,in_R8D);
  Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>_>
              *)(local_d8 + 0x10),&local_110);
  if (local_a4 == 0) {
    local_a0 = 0x7fffffff;
    local_d8._24_4_ = 0;
    local_d8._28_4_ = 0;
    local_b0 = 0;
    local_d8._16_8_ = (WirePointer *)0x0;
  }
  local_38 = (WirePointer *)local_d8._16_8_;
  local_30 = local_d8._24_8_;
  local_28 = local_b0;
  local_20 = local_a0;
  OVar7 = capnp::_::PointerReader::getCapability((PointerReader *)local_d8);
  plVar5 = local_90;
  *(undefined8 *)&__return_storage_ptr__->field_0x8 = local_d8._0_8_;
  *(undefined8 *)&__return_storage_ptr__->field_0x10 = local_d8._8_8_;
  local_d8._8_8_ = (CapTableReader *)0x0;
  __return_storage_ptr__->_vptr_Client =
       (_func_int **)&capnproto_test::capnp::test::TestMembrane::Thing::Client::typeinfo;
  if (local_90 != (long *)0x0) {
    local_90 = (long *)0x0;
    (**(code **)*local_98)(local_98,(long)plVar5 + *(long *)(*plVar5 + -0x10),OVar7.ptr);
  }
  pDVar4 = local_110.hook.disposer;
  uVar3 = local_110.super_Builder._builder._32_8_;
  if (local_110.super_Builder._builder._32_8_ != 0) {
    local_110.super_Builder._builder.dataSize = 0;
    local_110.super_Builder._builder.pointerCount = 0;
    local_110.super_Builder._builder._38_2_ = 0;
    local_110.hook.disposer = (Disposer *)0x0;
    (**(local_110.hook.ptr)->_vptr_RequestHook)(local_110.hook.ptr,uVar3,8,pDVar4,pDVar4,0);
  }
  pWVar2 = local_110.super_Builder._builder.pointers;
  if (local_110.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_110.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_110.super_Builder._builder.data)
              (local_110.super_Builder._builder.data,
               (long)&(pWVar2->offsetAndKind).value + *(long *)((long)*pWVar2 + -0x10));
  }
  pCVar1 = local_110.super_Builder._builder.capTable;
  if (local_110.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_110.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_110.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_110.super_Builder._builder.segment,
      (pCVar1->super_CapTableReader)._vptr_CapTableReader[-2] +
      (long)&(pCVar1->super_CapTableReader)._vptr_CapTableReader);
  }
  pRVar6 = local_88.hook.ptr;
  if (local_88.hook.ptr != (RequestHook *)0x0) {
    local_88.hook.ptr = (RequestHook *)0x0;
    (**(local_88.hook.disposer)->_vptr_Disposer)
              (local_88.hook.disposer,
               pRVar6->_vptr_RequestHook[-2] + (long)&pRVar6->_vptr_RequestHook);
  }
  return __return_storage_ptr__;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }